

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_diag_avx2_256_16.c
# Opt level: O2

parasail_result_t *
parasail_nw_table_diag_avx2_256_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int16_t iVar1;
  int *piVar2;
  int *piVar3;
  undefined1 auVar4 [32];
  uint uVar5;
  short sVar6;
  short sVar7;
  undefined1 auVar8 [32];
  short sVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  parasail_result_t *ppVar19;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  uint uVar20;
  long lVar21;
  char *pcVar22;
  int iVar23;
  ulong uVar24;
  short sVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  char *__format;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  undefined4 uVar37;
  uint uVar38;
  long lVar39;
  ulong uVar40;
  bool bVar41;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined2 uVar56;
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  short sVar59;
  undefined1 auVar60 [32];
  short sVar61;
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar65 [64];
  short sVar66;
  undefined1 auVar67 [32];
  undefined1 auVar68 [64];
  undefined1 auVar69 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  ulong local_308;
  uint local_300;
  ulong local_2f8;
  int16_t *local_2f0;
  ulong local_2e0;
  ulong local_2d8;
  ulong local_2d0;
  long local_248;
  ulong local_208;
  ulong local_200;
  ulong local_1f8;
  ulong local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  undefined1 local_118 [32];
  undefined1 auVar70 [64];
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar22 = "_s2";
  }
  else {
    uVar40 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar22 = "s2Len";
    }
    else if (open < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar22 = "open";
    }
    else if (gap < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar22 = "gap";
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      __format = "%s: missing %s\n";
      pcVar22 = "matrix";
    }
    else {
      if (matrix->type != 0) {
        _s1Len = matrix->length;
LAB_00758f7d:
        auVar71 = vpinsrd_avx(ZEXT416((uint)gap),open,1);
        auVar42 = vpmovsxbd_avx2(ZEXT816(0x100000000000000));
        auVar42 = vpermd_avx2(auVar42,ZEXT1632(auVar71));
        auVar42 = vpmulld_avx2(auVar42,_DAT_008a5ba0);
        iVar23 = auVar42._28_4_;
        iVar27 = -matrix->min;
        if (iVar23 < matrix->min) {
          iVar27 = open;
        }
        sVar25 = 0x7ffe - (short)matrix->max;
        auVar67 = ZEXT1632(in_ZMM7._0_16_);
        ppVar19 = parasail_result_new_table1(_s1Len,s2Len);
        if (ppVar19 != (parasail_result_t *)0x0) {
          ppVar19->flag = ppVar19->flag | 0x10221001;
          uVar32 = (ulong)(s2Len + 0x1e);
          ptr = parasail_memalign_int16_t(0x20,uVar32);
          ptr_00 = parasail_memalign_int16_t(0x20,uVar32);
          ptr_01 = parasail_memalign_int16_t(0x20,uVar32);
          if (ptr_01 != (int16_t *)0x0 && (ptr_00 != (int16_t *)0x0 && ptr != (int16_t *)0x0)) {
            lVar39 = (long)_s1Len;
            if (matrix->type == 0) {
              local_2f0 = parasail_memalign_int16_t(0x20,(long)(int)(_s1Len + 0xf));
              if (local_2f0 == (int16_t *)0x0) {
                return (parasail_result_t *)0x0;
              }
              for (uVar32 = 0; lVar21 = lVar39, (uint)(~(_s1Len >> 0x1f) & _s1Len) != uVar32;
                  uVar32 = uVar32 + 1) {
                local_2f0[uVar32] = (int16_t)matrix->mapper[(byte)_s1[uVar32]];
              }
              for (; lVar21 < (int)(_s1Len + 0xf); lVar21 = lVar21 + 1) {
                local_2f0[lVar21] = 0;
              }
            }
            else {
              local_2f0 = (int16_t *)0x0;
            }
            sVar7 = (short)gap;
            sVar6 = auVar42._28_2_;
            sVar66 = sVar6 + sVar7 * -4;
            sVar9 = (short)open;
            sVar61 = sVar7 * -5 - sVar9;
            sVar59 = sVar7 * -6 - sVar9;
            auVar71 = vpinsrd_avx(ZEXT416((uint)open),gap * 8,1);
            auVar53._0_2_ = (undefined2)_s1Len;
            auVar53._2_2_ = auVar53._0_2_;
            auVar53._4_2_ = auVar53._0_2_;
            auVar53._6_2_ = auVar53._0_2_;
            auVar53._8_2_ = auVar53._0_2_;
            auVar53._10_2_ = auVar53._0_2_;
            auVar53._12_2_ = auVar53._0_2_;
            auVar53._14_2_ = auVar53._0_2_;
            auVar53._16_2_ = auVar53._0_2_;
            auVar53._18_2_ = auVar53._0_2_;
            auVar53._20_2_ = auVar53._0_2_;
            auVar53._22_2_ = auVar53._0_2_;
            auVar53._24_2_ = auVar53._0_2_;
            auVar53._26_2_ = auVar53._0_2_;
            auVar53._28_2_ = auVar53._0_2_;
            auVar53._30_2_ = auVar53._0_2_;
            auVar4 = vpcmpeqd_avx2(auVar67,auVar67);
            auVar67 = vpaddsw_avx2(auVar53,auVar4);
            auVar54._0_2_ = (undefined2)s2Len;
            auVar54._2_2_ = auVar54._0_2_;
            auVar54._4_2_ = auVar54._0_2_;
            auVar54._6_2_ = auVar54._0_2_;
            auVar54._8_2_ = auVar54._0_2_;
            auVar54._10_2_ = auVar54._0_2_;
            auVar54._12_2_ = auVar54._0_2_;
            auVar54._14_2_ = auVar54._0_2_;
            auVar54._16_2_ = auVar54._0_2_;
            auVar54._18_2_ = auVar54._0_2_;
            auVar54._20_2_ = auVar54._0_2_;
            auVar54._22_2_ = auVar54._0_2_;
            auVar54._24_2_ = auVar54._0_2_;
            auVar54._26_2_ = auVar54._0_2_;
            auVar54._28_2_ = auVar54._0_2_;
            auVar54._30_2_ = auVar54._0_2_;
            auVar4 = vpaddsw_avx2(auVar54,auVar4);
            auVar53 = vpmovsxbd_avx2(ZEXT816(0x100000000000000));
            auVar53 = vpermd_avx2(auVar53,ZEXT1632(auVar71));
            uVar11 = s2Len + 0xf;
            local_300 = _s1Len - 1;
            auVar53 = vpsubd_avx2(auVar42,auVar53);
            iVar29 = s2Len + -1;
            iVar27 = iVar27 + -0x7fff;
            uVar56 = (undefined2)(gap * 0xfff9 - open);
            auVar42._2_2_ = uVar56;
            auVar42._0_2_ = uVar56;
            auVar42._4_2_ = uVar56;
            auVar42._6_2_ = uVar56;
            auVar42._8_2_ = uVar56;
            auVar42._10_2_ = uVar56;
            auVar42._12_2_ = uVar56;
            auVar42._14_2_ = uVar56;
            auVar42._16_2_ = uVar56;
            auVar42._18_2_ = uVar56;
            auVar42._20_2_ = uVar56;
            auVar42._22_2_ = uVar56;
            auVar42._24_2_ = uVar56;
            auVar42._26_2_ = uVar56;
            auVar42._28_2_ = uVar56;
            auVar42._30_2_ = uVar56;
            auVar57._2_2_ = sVar59;
            auVar57._0_2_ = sVar59;
            auVar57._4_2_ = sVar59;
            auVar57._6_2_ = sVar59;
            auVar57._8_2_ = sVar59;
            auVar57._10_2_ = sVar59;
            auVar57._12_2_ = sVar59;
            auVar57._14_2_ = sVar59;
            auVar57._16_2_ = sVar59;
            auVar57._18_2_ = sVar59;
            auVar57._20_2_ = sVar59;
            auVar57._22_2_ = sVar59;
            auVar57._24_2_ = sVar59;
            auVar57._26_2_ = sVar59;
            auVar57._28_2_ = sVar59;
            auVar57._30_2_ = sVar59;
            auVar42 = vpblendw_avx2(auVar42,auVar57,2);
            auVar43._0_2_ = (int16_t)iVar27;
            auVar43._2_2_ = auVar43._0_2_;
            auVar43._4_2_ = auVar43._0_2_;
            auVar43._6_2_ = auVar43._0_2_;
            auVar43._8_2_ = auVar43._0_2_;
            auVar43._10_2_ = auVar43._0_2_;
            auVar43._12_2_ = auVar43._0_2_;
            auVar43._14_2_ = auVar43._0_2_;
            auVar43._16_2_ = auVar43._0_2_;
            auVar43._18_2_ = auVar43._0_2_;
            auVar43._20_2_ = auVar43._0_2_;
            auVar43._22_2_ = auVar43._0_2_;
            auVar43._24_2_ = auVar43._0_2_;
            auVar43._26_2_ = auVar43._0_2_;
            auVar43._28_2_ = auVar43._0_2_;
            auVar43._30_2_ = auVar43._0_2_;
            auVar69._2_2_ = sVar25;
            auVar69._0_2_ = sVar25;
            auVar69._4_2_ = sVar25;
            auVar69._6_2_ = sVar25;
            auVar69._8_2_ = sVar25;
            auVar69._10_2_ = sVar25;
            auVar69._12_2_ = sVar25;
            auVar69._14_2_ = sVar25;
            auVar69._16_2_ = sVar25;
            auVar69._18_2_ = sVar25;
            auVar69._20_2_ = sVar25;
            auVar69._22_2_ = sVar25;
            auVar69._24_2_ = sVar25;
            auVar69._26_2_ = sVar25;
            auVar69._28_2_ = sVar25;
            auVar69._30_2_ = sVar25;
            auVar70 = ZEXT3264(auVar69);
            auVar58._2_2_ = sVar9;
            auVar58._0_2_ = sVar9;
            auVar58._4_2_ = sVar9;
            auVar58._6_2_ = sVar9;
            auVar58._8_2_ = sVar9;
            auVar58._10_2_ = sVar9;
            auVar58._12_2_ = sVar9;
            auVar58._14_2_ = sVar9;
            auVar58._16_2_ = sVar9;
            auVar58._18_2_ = sVar9;
            auVar58._20_2_ = sVar9;
            auVar58._22_2_ = sVar9;
            auVar58._24_2_ = sVar9;
            auVar58._26_2_ = sVar9;
            auVar58._28_2_ = sVar9;
            auVar58._30_2_ = sVar9;
            auVar44._2_2_ = sVar61;
            auVar44._0_2_ = sVar61;
            auVar44._4_2_ = sVar61;
            auVar44._6_2_ = sVar61;
            auVar44._8_2_ = sVar61;
            auVar44._10_2_ = sVar61;
            auVar44._12_2_ = sVar61;
            auVar44._14_2_ = sVar61;
            auVar44._16_2_ = sVar61;
            auVar44._18_2_ = sVar61;
            auVar44._20_2_ = sVar61;
            auVar44._22_2_ = sVar61;
            auVar44._24_2_ = sVar61;
            auVar44._26_2_ = sVar61;
            auVar44._28_2_ = sVar61;
            auVar44._30_2_ = sVar61;
            auVar42 = vpblendw_avx2(auVar42,auVar44,4);
            auVar60._2_2_ = sVar7;
            auVar60._0_2_ = sVar7;
            auVar60._4_2_ = sVar7;
            auVar60._6_2_ = sVar7;
            auVar60._8_2_ = sVar7;
            auVar60._10_2_ = sVar7;
            auVar60._12_2_ = sVar7;
            auVar60._14_2_ = sVar7;
            auVar60._16_2_ = sVar7;
            auVar60._18_2_ = sVar7;
            auVar60._20_2_ = sVar7;
            auVar60._22_2_ = sVar7;
            auVar60._24_2_ = sVar7;
            auVar60._26_2_ = sVar7;
            auVar60._28_2_ = sVar7;
            auVar60._30_2_ = sVar7;
            uVar56 = (undefined2)(gap << 4);
            auVar47._2_2_ = sVar66;
            auVar47._0_2_ = sVar66;
            auVar47._4_2_ = sVar66;
            auVar47._6_2_ = sVar66;
            auVar47._8_2_ = sVar66;
            auVar47._10_2_ = sVar66;
            auVar47._12_2_ = sVar66;
            auVar47._14_2_ = sVar66;
            auVar47._16_2_ = sVar66;
            auVar47._18_2_ = sVar66;
            auVar47._20_2_ = sVar66;
            auVar47._22_2_ = sVar66;
            auVar47._24_2_ = sVar66;
            auVar47._26_2_ = sVar66;
            auVar47._28_2_ = sVar66;
            auVar47._30_2_ = sVar66;
            auVar42 = vpblendw_avx2(auVar42,auVar47,8);
            auVar53 = vpshufb_avx2(auVar53,_DAT_008a5bc0);
            auVar53 = vpermq_avx2(auVar53,0xe8);
            auVar48._0_2_ = (undefined2)(gap * 0xfffd - open);
            auVar48._2_2_ = auVar48._0_2_;
            auVar48._4_2_ = auVar48._0_2_;
            auVar48._6_2_ = auVar48._0_2_;
            auVar48._8_2_ = auVar48._0_2_;
            auVar48._10_2_ = auVar48._0_2_;
            auVar48._12_2_ = auVar48._0_2_;
            auVar48._14_2_ = auVar48._0_2_;
            auVar48._16_2_ = auVar48._0_2_;
            auVar48._18_2_ = auVar48._0_2_;
            auVar48._20_2_ = auVar48._0_2_;
            auVar48._22_2_ = auVar48._0_2_;
            auVar48._24_2_ = auVar48._0_2_;
            auVar48._26_2_ = auVar48._0_2_;
            auVar48._28_2_ = auVar48._0_2_;
            auVar48._30_2_ = auVar48._0_2_;
            auVar42 = vpblendw_avx2(auVar42,auVar48,0x10);
            auVar49._0_2_ = (undefined2)(iVar23 + gap * -2);
            auVar49._2_2_ = auVar49._0_2_;
            auVar49._4_2_ = auVar49._0_2_;
            auVar49._6_2_ = auVar49._0_2_;
            auVar49._8_2_ = auVar49._0_2_;
            auVar49._10_2_ = auVar49._0_2_;
            auVar49._12_2_ = auVar49._0_2_;
            auVar49._14_2_ = auVar49._0_2_;
            auVar49._16_2_ = auVar49._0_2_;
            auVar49._18_2_ = auVar49._0_2_;
            auVar49._20_2_ = auVar49._0_2_;
            auVar49._22_2_ = auVar49._0_2_;
            auVar49._24_2_ = auVar49._0_2_;
            auVar49._26_2_ = auVar49._0_2_;
            auVar49._28_2_ = auVar49._0_2_;
            auVar49._30_2_ = auVar49._0_2_;
            auVar42 = vpblendw_avx2(auVar42,auVar49,0x20);
            auVar50._0_2_ = (undefined2)(iVar23 - gap);
            auVar50._2_2_ = auVar50._0_2_;
            auVar50._4_2_ = auVar50._0_2_;
            auVar50._6_2_ = auVar50._0_2_;
            auVar50._8_2_ = auVar50._0_2_;
            auVar50._10_2_ = auVar50._0_2_;
            auVar50._12_2_ = auVar50._0_2_;
            auVar50._14_2_ = auVar50._0_2_;
            auVar50._16_2_ = auVar50._0_2_;
            auVar50._18_2_ = auVar50._0_2_;
            auVar50._20_2_ = auVar50._0_2_;
            auVar50._22_2_ = auVar50._0_2_;
            auVar50._24_2_ = auVar50._0_2_;
            auVar50._26_2_ = auVar50._0_2_;
            auVar50._28_2_ = auVar50._0_2_;
            auVar50._30_2_ = auVar50._0_2_;
            auVar42 = vpblendw_avx2(auVar42,auVar50,0x40);
            auVar51._2_2_ = sVar6;
            auVar51._0_2_ = sVar6;
            auVar51._4_2_ = sVar6;
            auVar51._6_2_ = sVar6;
            auVar51._8_2_ = sVar6;
            auVar51._10_2_ = sVar6;
            auVar51._12_2_ = sVar6;
            auVar51._14_2_ = sVar6;
            auVar51._16_2_ = sVar6;
            auVar51._18_2_ = sVar6;
            auVar51._20_2_ = sVar6;
            auVar51._22_2_ = sVar6;
            auVar51._24_2_ = sVar6;
            auVar51._26_2_ = sVar6;
            auVar51._28_2_ = sVar6;
            auVar51._30_2_ = sVar6;
            auVar42 = vpblendw_avx2(auVar42,auVar51,0x80);
            local_118 = vpblendd_avx2(auVar53,auVar42,0xf0);
            piVar2 = matrix->mapper;
            for (uVar32 = 0; uVar40 != uVar32; uVar32 = uVar32 + 1) {
              ptr[uVar32 + 0xf] = (int16_t)piVar2[(byte)_s2[uVar32]];
            }
            for (lVar21 = 0; uVar32 = uVar40, lVar21 != 0xf; lVar21 = lVar21 + 1) {
              ptr[lVar21] = 0;
            }
            for (; (int)uVar32 < (int)uVar11; uVar32 = uVar32 + 1) {
              ptr[uVar32 + 0xf] = 0;
            }
            iVar30 = iVar23;
            for (uVar32 = 0; uVar40 != uVar32; uVar32 = uVar32 + 1) {
              ptr_00[uVar32 + 0xf] = (int16_t)iVar30;
              iVar30 = iVar30 - gap;
              ptr_01[uVar32 + 0xf] = auVar43._0_2_;
            }
            for (lVar21 = 0; uVar32 = uVar40, lVar21 != 0xf; lVar21 = lVar21 + 1) {
              ptr_00[lVar21] = auVar43._0_2_;
              ptr_01[lVar21] = auVar43._0_2_;
            }
            for (; (int)uVar32 < (int)uVar11; uVar32 = uVar32 + 1) {
              ptr_00[uVar32 + 0xf] = auVar43._0_2_;
              ptr_01[uVar32 + 0xf] = auVar43._0_2_;
            }
            ptr_00[0xe] = 0;
            auVar53 = vpalignr_avx2(ZEXT1632(auVar43._16_16_),auVar43,2);
            lVar21 = uVar40 * 4;
            auVar42 = vpmovsxbw_avx2(_DAT_008a5c74);
            local_248 = 0;
            uVar32 = 0;
            auVar68 = ZEXT3264(auVar43);
            auVar65 = ZEXT3264(auVar43);
            while ((long)uVar32 < lVar39) {
              uVar5 = (uint)uVar32;
              if (matrix->type == 0) {
                uVar12 = (uint)local_2f0[uVar32 + 1];
                uVar13 = (uint)local_2f0[uVar32 + 2];
                uVar26 = (uint)local_2f0[uVar32 + 3];
                uVar14 = (uint)local_2f0[uVar32 + 4];
                uVar36 = (uint)local_2f0[uVar32 + 5];
                uVar15 = (uint)local_2f0[uVar32 + 6];
                uVar34 = (uint)local_2f0[uVar32 + 7];
                uVar16 = (uint)local_2f0[uVar32 + 8];
                uVar35 = (uint)local_2f0[uVar32 + 9];
                uVar17 = (uint)local_2f0[uVar32 + 10];
                uVar28 = (uint)local_2f0[uVar32 + 0xb];
                uVar18 = (uint)local_2f0[uVar32 + 0xc];
                uVar38 = (uint)local_2f0[uVar32 + 0xd];
                uVar20 = (uint)local_2f0[uVar32 + 0xe];
                uVar31 = (int)local_2f0[uVar32];
                uVar10 = (int)local_2f0[uVar32 + 0xf];
              }
              else {
                uVar12 = local_300;
                if ((long)(uVar32 | 1) < lVar39) {
                  uVar12 = uVar5 | 1;
                }
                uVar13 = uVar5 | 2;
                if (lVar39 <= (long)(uVar32 | 2)) {
                  uVar13 = local_300;
                }
                uVar26 = uVar5 | 3;
                if (lVar39 <= (long)(uVar32 | 3)) {
                  uVar26 = local_300;
                }
                uVar14 = uVar5 | 4;
                if (lVar39 <= (long)(uVar32 | 4)) {
                  uVar14 = local_300;
                }
                uVar36 = uVar5 | 5;
                if (lVar39 <= (long)(uVar32 | 5)) {
                  uVar36 = local_300;
                }
                uVar15 = uVar5 | 6;
                if (lVar39 <= (long)(uVar32 | 6)) {
                  uVar15 = local_300;
                }
                uVar34 = uVar5 | 7;
                if (lVar39 <= (long)(uVar32 | 7)) {
                  uVar34 = local_300;
                }
                uVar16 = uVar5 | 8;
                if (lVar39 <= (long)(uVar32 | 8)) {
                  uVar16 = local_300;
                }
                uVar35 = uVar5 | 9;
                if (lVar39 <= (long)(uVar32 | 9)) {
                  uVar35 = local_300;
                }
                uVar17 = uVar5 | 10;
                if (lVar39 <= (long)(uVar32 | 10)) {
                  uVar17 = local_300;
                }
                uVar28 = uVar5 | 0xb;
                if (lVar39 <= (long)(uVar32 | 0xb)) {
                  uVar28 = local_300;
                }
                uVar18 = uVar5 | 0xc;
                if (lVar39 <= (long)(uVar32 | 0xc)) {
                  uVar18 = local_300;
                }
                uVar38 = uVar5 | 0xd;
                if (lVar39 <= (long)(uVar32 | 0xd)) {
                  uVar38 = local_300;
                }
                uVar20 = uVar5 | 0xe;
                if (lVar39 <= (long)(uVar32 | 0xe)) {
                  uVar20 = local_300;
                }
                uVar31 = uVar5;
                uVar10 = uVar5 | 0xf;
                if (lVar39 <= (long)(uVar32 | 0xf)) {
                  uVar10 = local_300;
                }
              }
              local_1c0 = uVar32 | 2;
              local_1c8 = uVar32 | 3;
              local_1d0 = uVar32 | 4;
              local_1d8 = uVar32 | 5;
              local_1e0 = uVar32 | 6;
              local_1e8 = uVar32 | 9;
              local_1f8 = uVar32 | 0xe;
              local_200 = uVar32 | 0xf;
              local_208 = uVar32 | 1;
              local_2d0 = uVar32 | 0xb;
              local_2d8 = uVar32 | 0xc;
              local_2e0 = uVar32 | 0xd;
              local_2f8 = uVar32 | 7;
              local_308 = uVar32 | 8;
              uVar24 = uVar32 | 10;
              iVar30 = matrix->size;
              piVar2 = matrix->matrix;
              uVar32 = uVar32 + 0x10;
              iVar1 = ptr_00[0xe];
              auVar52._2_2_ = iVar1;
              auVar52._0_2_ = iVar1;
              auVar52._4_2_ = iVar1;
              auVar52._6_2_ = iVar1;
              auVar52._8_2_ = iVar1;
              auVar52._10_2_ = iVar1;
              auVar52._12_2_ = iVar1;
              auVar52._14_2_ = iVar1;
              auVar52._16_2_ = iVar1;
              auVar52._18_2_ = iVar1;
              auVar52._20_2_ = iVar1;
              auVar52._22_2_ = iVar1;
              auVar52._24_2_ = iVar1;
              auVar52._26_2_ = iVar1;
              auVar52._28_2_ = iVar1;
              auVar52._30_2_ = iVar1;
              ptr_00[0xe] = sVar6 - (short)uVar32 * sVar7;
              auVar44 = vpblendw_avx2(auVar53,auVar52,0x80);
              auVar51 = vpblendd_avx2(auVar53,auVar44,0xf0);
              auVar45._0_2_ = (undefined2)(iVar23 - uVar5 * gap);
              auVar45._2_2_ = auVar45._0_2_;
              auVar45._4_2_ = auVar45._0_2_;
              auVar45._6_2_ = auVar45._0_2_;
              auVar45._8_2_ = auVar45._0_2_;
              auVar45._10_2_ = auVar45._0_2_;
              auVar45._12_2_ = auVar45._0_2_;
              auVar45._14_2_ = auVar45._0_2_;
              auVar45._16_2_ = auVar45._0_2_;
              auVar45._18_2_ = auVar45._0_2_;
              auVar45._20_2_ = auVar45._0_2_;
              auVar45._22_2_ = auVar45._0_2_;
              auVar45._24_2_ = auVar45._0_2_;
              auVar45._26_2_ = auVar45._0_2_;
              auVar45._28_2_ = auVar45._0_2_;
              auVar45._30_2_ = auVar45._0_2_;
              auVar44 = vpblendw_avx2(auVar53,auVar45,0x80);
              auVar47 = vpblendd_avx2(auVar53,auVar44,0xf0);
              auVar50 = vpcmpeqw_avx2(auVar42,auVar67);
              auVar44 = vpmovsxbw_avx2(_DAT_008a5c84);
              auVar49 = auVar43;
              auVar48 = auVar43;
              for (uVar33 = 0; (~((int)uVar11 >> 0x1f) & uVar11) != uVar33; uVar33 = uVar33 + 1) {
                auVar71 = vpinsrw_avx(ZEXT416((uint)piVar2[(long)(int)(uVar34 * iVar30) +
                                                           (long)ptr[uVar33 + 8]]),
                                      (uint)*(ushort *)
                                             (piVar2 + (long)(int)(uVar15 * iVar30) +
                                                       (long)ptr[uVar33 + 9]),1);
                auVar71 = vpinsrw_avx(auVar71,(uint)*(ushort *)
                                                     (piVar2 + (long)(int)(uVar36 * iVar30) +
                                                               (long)ptr[uVar33 + 10]),2);
                auVar71 = vpinsrw_avx(auVar71,(uint)*(ushort *)
                                                     (piVar2 + (long)(int)(uVar14 * iVar30) +
                                                               (long)ptr[uVar33 + 0xb]),3);
                auVar71 = vpinsrw_avx(auVar71,(uint)*(ushort *)
                                                     (piVar2 + (long)(int)(uVar26 * iVar30) +
                                                               (long)ptr[uVar33 + 0xc]),4);
                auVar71 = vpinsrw_avx(auVar71,(uint)*(ushort *)
                                                     (piVar2 + (long)(int)(uVar13 * iVar30) +
                                                               (long)ptr[uVar33 + 0xd]),5);
                auVar71 = vpinsrw_avx(auVar71,(uint)*(ushort *)
                                                     (piVar2 + (long)(int)(uVar12 * iVar30) +
                                                               (long)ptr[uVar33 + 0xe]),6);
                auVar71 = vpinsrw_avx(auVar71,(uint)*(ushort *)
                                                     (piVar2 + (long)(int)(uVar31 * iVar30) +
                                                               (long)ptr[uVar33 + 0xf]),7);
                auVar72 = vpinsrw_avx(ZEXT416((uint)piVar2[(long)(int)(uVar10 * iVar30) +
                                                           (long)ptr[uVar33]]),
                                      (uint)*(ushort *)
                                             (piVar2 + (long)(int)(uVar20 * iVar30) +
                                                       (long)ptr[uVar33 + 1]),1);
                auVar72 = vpinsrw_avx(auVar72,(uint)*(ushort *)
                                                     (piVar2 + (long)(int)(uVar38 * iVar30) +
                                                               (long)ptr[uVar33 + 2]),2);
                auVar72 = vpinsrw_avx(auVar72,(uint)*(ushort *)
                                                     (piVar2 + (long)(int)(uVar18 * iVar30) +
                                                               (long)ptr[uVar33 + 3]),3);
                auVar72 = vpinsrw_avx(auVar72,(uint)*(ushort *)
                                                     (piVar2 + (long)(int)(uVar28 * iVar30) +
                                                               (long)ptr[uVar33 + 4]),4);
                auVar72 = vpinsrw_avx(auVar72,(uint)*(ushort *)
                                                     (piVar2 + (long)(int)(uVar17 * iVar30) +
                                                               (long)ptr[uVar33 + 5]),5);
                auVar72 = vpinsrw_avx(auVar72,(uint)*(ushort *)
                                                     (piVar2 + (long)(int)(uVar35 * iVar30) +
                                                               (long)ptr[uVar33 + 6]),6);
                auVar72 = vpinsrw_avx(auVar72,(uint)*(ushort *)
                                                     (piVar2 + (long)(int)(uVar16 * iVar30) +
                                                               (long)ptr[uVar33 + 7]),7);
                iVar1 = ptr_00[uVar33 + 0xf];
                auVar62._2_2_ = iVar1;
                auVar62._0_2_ = iVar1;
                auVar62._4_2_ = iVar1;
                auVar62._6_2_ = iVar1;
                auVar62._8_2_ = iVar1;
                auVar62._10_2_ = iVar1;
                auVar62._12_2_ = iVar1;
                auVar62._14_2_ = iVar1;
                auVar62._16_2_ = iVar1;
                auVar62._18_2_ = iVar1;
                auVar62._20_2_ = iVar1;
                auVar62._22_2_ = iVar1;
                auVar62._24_2_ = iVar1;
                auVar62._26_2_ = iVar1;
                auVar62._28_2_ = iVar1;
                auVar62._30_2_ = iVar1;
                auVar54 = vpalignr_avx2(ZEXT1632(auVar47._16_16_),auVar47,2);
                auVar57 = vpblendw_avx2(auVar54,auVar62,0x80);
                auVar57 = vpblendd_avx2(auVar54,auVar57,0xf0);
                auVar48 = vpalignr_avx2(ZEXT1632(auVar48._16_16_),auVar48,2);
                iVar1 = ptr_01[uVar33 + 0xf];
                auVar63._2_2_ = iVar1;
                auVar63._0_2_ = iVar1;
                auVar63._4_2_ = iVar1;
                auVar63._6_2_ = iVar1;
                auVar63._8_2_ = iVar1;
                auVar63._10_2_ = iVar1;
                auVar63._12_2_ = iVar1;
                auVar63._14_2_ = iVar1;
                auVar63._16_2_ = iVar1;
                auVar63._18_2_ = iVar1;
                auVar63._20_2_ = iVar1;
                auVar63._22_2_ = iVar1;
                auVar63._24_2_ = iVar1;
                auVar63._26_2_ = iVar1;
                auVar63._28_2_ = iVar1;
                auVar63._30_2_ = iVar1;
                auVar54 = vpblendw_avx2(auVar48,auVar63,0x80);
                auVar54 = vpblendd_avx2(auVar48,auVar54,0xf0);
                auVar48 = vpsubsw_avx2(auVar57,auVar58);
                auVar54 = vpsubsw_avx2(auVar54,auVar60);
                auVar48 = vpmaxsw_avx2(auVar48,auVar54);
                auVar47 = vpsubsw_avx2(auVar47,auVar58);
                auVar49 = vpsubsw_avx2(auVar49,auVar60);
                auVar54 = vpmaxsw_avx2(auVar49,auVar47);
                auVar55._0_16_ = ZEXT116(0) * auVar71 + ZEXT116(1) * auVar72;
                auVar55._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar71;
                auVar47 = vpaddsw_avx2(auVar51,auVar55);
                auVar49 = vpmaxsw_avx2(auVar54,auVar48);
                auVar47 = vpmaxsw_avx2(auVar47,auVar49);
                auVar49 = vpcmpeqw_avx2(auVar44,_DAT_008a5a80);
                auVar47 = vpblendvb_avx2(auVar47,local_118,auVar49);
                if (0xf < uVar33) {
                  auVar51 = vpminsw_avx2(auVar70._0_32_,auVar47);
                  auVar70 = ZEXT3264(auVar51);
                  auVar51 = vpmaxsw_avx2(auVar65._0_32_,auVar47);
                  auVar65 = ZEXT3264(auVar51);
                }
                piVar3 = ((ppVar19->field_4).rowcols)->score_row;
                auVar71 = auVar47._0_16_;
                auVar72 = auVar47._16_16_;
                if (uVar33 < uVar40) {
                  uVar37 = vpextrw_avx(auVar72,7);
                  *(int *)((long)piVar3 + uVar33 * 4 + local_248) = (int)(short)uVar37;
                }
                if (uVar33 - 1 < uVar40 && (long)local_208 < lVar39) {
                  uVar37 = vpextrw_avx(auVar72,6);
                  *(int *)((long)piVar3 + uVar33 * 4 + lVar21 * local_208 + -4) = (int)(short)uVar37
                  ;
                }
                if (((long)local_1c0 < lVar39) && ((long)(uVar33 - 2) < (long)uVar40 && 1 < uVar33))
                {
                  uVar37 = vpextrw_avx(auVar72,5);
                  *(int *)((long)piVar3 + uVar33 * 4 + lVar21 * local_1c0 + -8) = (int)(short)uVar37
                  ;
                }
                if (((long)local_1c8 < lVar39) && ((long)(uVar33 - 3) < (long)uVar40 && 2 < uVar33))
                {
                  uVar37 = vpextrw_avx(auVar72,4);
                  *(int *)((long)piVar3 + uVar33 * 4 + lVar21 * local_1c8 + -0xc) =
                       (int)(short)uVar37;
                }
                if (((long)local_1d0 < lVar39) && ((long)(uVar33 - 4) < (long)uVar40 && 3 < uVar33))
                {
                  uVar37 = vpextrw_avx(auVar72,3);
                  *(int *)((long)piVar3 + uVar33 * 4 + lVar21 * local_1d0 + -0x10) =
                       (int)(short)uVar37;
                }
                if (((long)local_1d8 < lVar39) && ((long)(uVar33 - 5) < (long)uVar40 && 4 < uVar33))
                {
                  uVar37 = vpextrw_avx(auVar72,2);
                  *(int *)((long)piVar3 + uVar33 * 4 + lVar21 * local_1d8 + -0x14) =
                       (int)(short)uVar37;
                }
                if (((long)local_1e0 < lVar39) && ((long)(uVar33 - 6) < (long)uVar40 && 5 < uVar33))
                {
                  uVar37 = vpextrw_avx(auVar72,1);
                  *(int *)((long)piVar3 + uVar33 * 4 + lVar21 * local_1e0 + -0x18) =
                       (int)(short)uVar37;
                }
                if (((long)local_2f8 < lVar39) && ((long)(uVar33 - 7) < (long)uVar40 && 6 < uVar33))
                {
                  *(int *)((long)piVar3 + uVar33 * 4 + lVar21 * local_2f8 + -0x1c) =
                       (int)auVar47._16_2_;
                }
                if (((long)local_308 < lVar39) && ((long)(uVar33 - 8) < (long)uVar40 && 7 < uVar33))
                {
                  uVar37 = vpextrw_avx(auVar71,7);
                  *(int *)((long)piVar3 + uVar33 * 4 + lVar21 * local_308 + -0x20) =
                       (int)(short)uVar37;
                }
                if (((long)local_1e8 < lVar39) && ((long)(uVar33 - 9) < (long)uVar40 && 8 < uVar33))
                {
                  uVar37 = vpextrw_avx(auVar71,6);
                  *(int *)((long)piVar3 + uVar33 * 4 + lVar21 * local_1e8 + -0x24) =
                       (int)(short)uVar37;
                }
                if (((long)uVar24 < lVar39) && ((long)(uVar33 - 10) < (long)uVar40 && 9 < uVar33)) {
                  uVar37 = vpextrw_avx(auVar71,5);
                  *(int *)((long)piVar3 + uVar33 * 4 + lVar21 * uVar24 + -0x28) = (int)(short)uVar37
                  ;
                }
                if (((long)local_2d0 < lVar39) &&
                   ((long)(uVar33 - 0xb) < (long)uVar40 && 10 < uVar33)) {
                  uVar37 = vpextrw_avx(auVar71,4);
                  *(int *)((long)piVar3 + uVar33 * 4 + lVar21 * local_2d0 + -0x2c) =
                       (int)(short)uVar37;
                }
                if (((long)local_2d8 < lVar39) &&
                   ((long)(uVar33 - 0xc) < (long)uVar40 && 0xb < uVar33)) {
                  uVar37 = vpextrw_avx(auVar71,3);
                  *(int *)((long)piVar3 + uVar33 * 4 + lVar21 * local_2d8 + -0x30) =
                       (int)(short)uVar37;
                }
                if (((long)local_2e0 < lVar39) &&
                   ((long)(uVar33 - 0xd) < (long)uVar40 && 0xc < uVar33)) {
                  uVar37 = vpextrw_avx(auVar71,2);
                  *(int *)((long)piVar3 + uVar33 * 4 + lVar21 * local_2e0 + -0x34) =
                       (int)(short)uVar37;
                }
                if (((long)local_1f8 < lVar39) &&
                   ((long)(uVar33 - 0xe) < (long)uVar40 && 0xd < uVar33)) {
                  uVar37 = vpextrw_avx(auVar71,1);
                  *(int *)((long)piVar3 + uVar33 * 4 + lVar21 * local_1f8 + -0x38) =
                       (int)(short)uVar37;
                }
                if (0xe < uVar33 && (long)local_200 < lVar39) {
                  *(int *)((long)piVar3 + uVar33 * 4 + lVar21 * local_200 + -0x3c) =
                       (int)auVar47._0_2_;
                }
                auVar48 = vpblendvb_avx2(auVar48,auVar43,auVar49);
                auVar49 = vpblendvb_avx2(auVar54,auVar43,auVar49);
                ptr_00[uVar33] = auVar47._0_2_;
                vpextrw_avx(auVar48._0_16_,0);
                auVar51 = vpcmpeqw_avx2(auVar44,auVar4);
                auVar51 = vpand_avx2(auVar51,auVar50);
                auVar64._8_2_ = 1;
                auVar64._0_8_ = 0x1000100010001;
                auVar64._10_2_ = 1;
                auVar64._12_2_ = 1;
                auVar64._14_2_ = 1;
                auVar64._16_2_ = 1;
                auVar64._18_2_ = 1;
                auVar64._20_2_ = 1;
                auVar64._22_2_ = 1;
                auVar64._24_2_ = 1;
                auVar64._26_2_ = 1;
                auVar64._28_2_ = 1;
                auVar64._30_2_ = 1;
                auVar51 = vpblendvb_avx2(auVar68._0_32_,auVar47,auVar51);
                auVar68 = ZEXT3264(auVar51);
                auVar44 = vpaddsw_avx2(auVar44,auVar64);
                auVar51 = auVar57;
              }
              auVar46._8_2_ = 0x10;
              auVar46._0_8_ = 0x10001000100010;
              auVar46._10_2_ = 0x10;
              auVar46._12_2_ = 0x10;
              auVar46._14_2_ = 0x10;
              auVar46._16_2_ = 0x10;
              auVar46._18_2_ = 0x10;
              auVar46._20_2_ = 0x10;
              auVar46._22_2_ = 0x10;
              auVar46._24_2_ = 0x10;
              auVar46._26_2_ = 0x10;
              auVar46._28_2_ = 0x10;
              auVar46._30_2_ = 0x10;
              auVar42 = vpaddsw_avx2(auVar42,auVar46);
              auVar8._2_2_ = uVar56;
              auVar8._0_2_ = uVar56;
              auVar8._4_2_ = uVar56;
              auVar8._6_2_ = uVar56;
              auVar8._8_2_ = uVar56;
              auVar8._10_2_ = uVar56;
              auVar8._12_2_ = uVar56;
              auVar8._14_2_ = uVar56;
              auVar8._16_2_ = uVar56;
              auVar8._18_2_ = uVar56;
              auVar8._20_2_ = uVar56;
              auVar8._22_2_ = uVar56;
              auVar8._24_2_ = uVar56;
              auVar8._26_2_ = uVar56;
              auVar8._28_2_ = uVar56;
              auVar8._30_2_ = uVar56;
              local_118 = vpsubsw_avx2(local_118,auVar8);
              local_248 = local_248 + uVar40 * 0x40;
            }
            iVar23 = 0x10;
            while( true ) {
              sVar25 = (short)iVar27;
              bVar41 = iVar23 == 0;
              iVar23 = iVar23 + -1;
              if (bVar41) break;
              iVar30 = vpextrw_avx(auVar68._16_16_,7);
              if ((short)iVar30 <= sVar25) {
                iVar30 = iVar27;
              }
              iVar27 = iVar30;
              auVar67 = auVar68._0_32_;
              auVar42 = vperm2i128_avx2(auVar67,auVar67,0x28);
              auVar42 = vpalignr_avx2(auVar67,auVar42,0xe);
              auVar68 = ZEXT3264(auVar42);
            }
            auVar42 = vpcmpgtw_avx2(auVar43,auVar70._0_32_);
            auVar67 = vpcmpgtw_avx2(auVar65._0_32_,auVar69);
            auVar42 = vpor_avx2(auVar42,auVar67);
            if ((((((((((((((((((((((((((((((((auVar42 >> 7 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0 ||
                                             (auVar42 >> 0xf & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar42 >> 0x17 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar42 >> 0x1f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar42 >> 0x27 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar42 >> 0x2f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar42 >> 0x37 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar42 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar42 >> 0x47 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar42 >> 0x4f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar42 >> 0x57 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar42 >> 0x5f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar42 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar42 >> 0x6f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar42 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar42 >> 0x7f,0) != '\0') ||
                              (auVar42 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                             (auVar42 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar42 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar42 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar42 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar42 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar42 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar42 >> 0xbf,0) != '\0') ||
                      (auVar42 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar42 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar42 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar42 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar42 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar42 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar42 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                auVar42[0x1f] < '\0') {
              *(byte *)&ppVar19->flag = (byte)ppVar19->flag | 0x40;
              sVar25 = 0;
              iVar29 = 0;
              local_300 = 0;
            }
            ppVar19->score = (int)sVar25;
            ppVar19->end_query = local_300;
            ppVar19->end_ref = iVar29;
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            if (matrix->type == 0) {
              parasail_free(local_2f0);
              return ppVar19;
            }
            return ppVar19;
          }
        }
        return (parasail_result_t *)0x0;
      }
      if (_s1 == (char *)0x0) {
        __format = "%s: missing %s\n";
        pcVar22 = "_s1";
      }
      else {
        if (0 < _s1Len) goto LAB_00758f7d;
        __format = "%s: %s must be > 0\n";
        pcVar22 = "_s1Len";
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_table_diag_avx2_256_16",pcVar22);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vOpen;
    __m256i vGap;
    __m256i vOne;
    __m256i vN;
    __m256i vGapN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMax;
    __m256i vILimit;
    __m256i vILimit1;
    __m256i vJLimit;
    __m256i vJLimit1;
    __m256i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 16; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi16(NEG_LIMIT);
    vOpen = _mm256_set1_epi16(open);
    vGap  = _mm256_set1_epi16(gap);
    vOne = _mm256_set1_epi16(1);
    vN = _mm256_set1_epi16(N);
    vGapN = _mm256_set1_epi16(gap*N);
    vNegOne = _mm256_set1_epi16(-1);
    vI = _mm256_set_epi16(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15);
    vJreset = _mm256_set_epi16(0,-1,-2,-3,-4,-5,-6,-7,-8,-9,-10,-11,-12,-13,-14,-15);
    vMax = vNegInf;
    vILimit = _mm256_set1_epi16(s1Len);
    vILimit1 = _mm256_subs_epi16(vILimit, vOne);
    vJLimit = _mm256_set1_epi16(s2Len);
    vJLimit1 = _mm256_subs_epi16(vJLimit, vOne);
    vIBoundary = _mm256_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap,
            -open-8*gap,
            -open-9*gap,
            -open-10*gap,
            -open-11*gap,
            -open-12*gap,
            -open-13*gap,
            -open-14*gap,
            -open-15*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf;
        __m256i vWH = vNegInf;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        const int * const restrict matrow8 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+8] : ((i+8 >= s1Len) ? s1Len-1 : i+8))];
        const int * const restrict matrow9 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+9] : ((i+9 >= s1Len) ? s1Len-1 : i+9))];
        const int * const restrict matrow10 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+10] : ((i+10 >= s1Len) ? s1Len-1 : i+10))];
        const int * const restrict matrow11 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+11] : ((i+11 >= s1Len) ? s1Len-1 : i+11))];
        const int * const restrict matrow12 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+12] : ((i+12 >= s1Len) ? s1Len-1 : i+12))];
        const int * const restrict matrow13 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+13] : ((i+13 >= s1Len) ? s1Len-1 : i+13))];
        const int * const restrict matrow14 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+14] : ((i+14 >= s1Len) ? s1Len-1 : i+14))];
        const int * const restrict matrow15 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+15] : ((i+15 >= s1Len) ? s1Len-1 : i+15))];
        vNH = _mm256_srli_si256_rpl(vNH, 2);
        vNH = _mm256_insert_epi16_rpl(vNH, H_pr[-1], 15);
        vWH = _mm256_srli_si256_rpl(vWH, 2);
        vWH = _mm256_insert_epi16_rpl(vWH, -open - i*gap, 15);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 2);
            vNH = _mm256_insert_epi16_rpl(vNH, H_pr[j], 15);
            vF = _mm256_srli_si256_rpl(vF, 2);
            vF = _mm256_insert_epi16_rpl(vF, F_pr[j], 15);
            vF = _mm256_max_epi16(
                    _mm256_subs_epi16(vNH, vOpen),
                    _mm256_subs_epi16(vF, vGap));
            vE = _mm256_max_epi16(
                    _mm256_subs_epi16(vWH, vOpen),
                    _mm256_subs_epi16(vE, vGap));
            vMat = _mm256_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]],
                    matrow8[s2[j-8]],
                    matrow9[s2[j-9]],
                    matrow10[s2[j-10]],
                    matrow11[s2[j-11]],
                    matrow12[s2[j-12]],
                    matrow13[s2[j-13]],
                    matrow14[s2[j-14]],
                    matrow15[s2[j-15]]
                    );
            vNWH = _mm256_adds_epi16(vNWH, vMat);
            vWH = _mm256_max_epi16(vNWH, vE);
            vWH = _mm256_max_epi16(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm256_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vWH,0);
            F_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m256i cond_valid_I = _mm256_cmpeq_epi16(vI, vILimit1);
                __m256i cond_valid_J = _mm256_cmpeq_epi16(vJ, vJLimit1);
                __m256i cond_all = _mm256_and_si256(cond_valid_I, cond_valid_J);
                vMax = _mm256_blendv_epi8(vMax, vWH, cond_all);
            }
            vJ = _mm256_adds_epi16(vJ, vOne);
        }
        vI = _mm256_adds_epi16(vI, vN);
        vIBoundary = _mm256_subs_epi16(vIBoundary, vGapN);
    }

    /* max in vMax */
    for (i=0; i<N; ++i) {
        int16_t value;
        value = (int16_t) _mm256_extract_epi16_rpl(vMax, 15);
        if (value > score) {
            score = value;
        }
        vMax = _mm256_slli_si256_rpl(vMax, 2);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}